

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

float __thiscall cnn::Trainer::clip_gradients(Trainer *this)

{
  float fVar1;
  float fVar2;
  
  fVar2 = 1.0;
  if (this->clipping_enabled != 0.0) {
    fVar1 = Model::gradient_l2_norm(this->model);
    fVar2 = 1.0;
    if (this->clip_threshold < fVar1) {
      this->clips = this->clips + 1.0;
      fVar2 = this->clip_threshold / fVar1;
    }
  }
  return fVar2;
}

Assistant:

float Trainer::clip_gradients() {
  float gscale = 1;
  if (clipping_enabled) {
    float gg = model->gradient_l2_norm();
    if (isnan(gg) || isinf(gg)) {
      cerr << "Magnitude of gradient is bad: " << gg << endl;
      abort();
    }
    if (gg > clip_threshold) {
      ++clips;
      gscale = clip_threshold / gg;
    }
  }
  return gscale;
}